

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFileSystemTreeView.cpp
# Opt level: O2

Sections __thiscall QFileSystemTreeView::visibleSections(QFileSystemTreeView *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  anon_class_8_1_8991fb9c isSectionHidden;
  
  isSectionHidden.this = this;
  QTreeView::header();
  iVar4 = QHeaderView::hiddenSectionCount();
  if (iVar4 < 1) {
    uVar5 = 0;
  }
  else {
    bVar2 = visibleSections::anon_class_8_1_8991fb9c::operator()(&isSectionHidden,Name);
    bVar3 = visibleSections::anon_class_8_1_8991fb9c::operator()(&isSectionHidden,Size);
    uVar5 = !bVar2 + 2;
    if (bVar3) {
      uVar5 = (uint)!bVar2;
    }
    bVar2 = visibleSections::anon_class_8_1_8991fb9c::operator()(&isSectionHidden,Type);
    uVar1 = uVar5 + 4;
    if (bVar2) {
      uVar1 = uVar5;
    }
    bVar2 = visibleSections::anon_class_8_1_8991fb9c::operator()(&isSectionHidden,LastModification);
    uVar5 = uVar1 | 8;
    if (bVar2) {
      uVar5 = uVar1;
    }
  }
  return (Sections)uVar5;
}

Assistant:

QFileSystemTreeView::Sections QFileSystemTreeView::visibleSections() const {
    const auto isSectionHidden = [this](QFileSystemTreeView::Column column) {
        return header()->isSectionHidden(static_cast<int>(column));
    };
    QFileSystemTreeView::Sections sections = QFileSystemTreeView::Section::All;

    if (header()->hiddenSectionCount() > 0) {
        if (!isSectionHidden(QFileSystemTreeView::Column::Name)) {
            sections |= QFileSystemTreeView::Section::Name;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::Size)) {
            sections |= QFileSystemTreeView::Section::Size;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::Type)) {
            sections |= QFileSystemTreeView::Section::Type;
        }

        if (!isSectionHidden(QFileSystemTreeView::Column::LastModification)) {
            sections |= QFileSystemTreeView::Section::LastModification;
        }
    }

    return sections;
}